

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O2

size_t FSE_compress_usingCTable_generic
                 (void *dst,size_t dstSize,void *src,size_t srcSize,FSE_CTable *ct,uint fast)

{
  byte *pbVar1;
  uint uVar2;
  ulong *puVar3;
  BYTE *istart;
  byte *pbVar4;
  BIT_CStream_t bitC;
  FSE_CState_t CState2;
  FSE_CState_t CState1;
  BIT_CStream_t local_98;
  FSE_CState_t local_70;
  FSE_CState_t local_50;
  
  if (srcSize < 3) {
    return 0;
  }
  local_98.bitContainer = 0;
  local_98.bitPos = 0;
  local_98.endPtr = (char *)((long)dst + (dstSize - 8));
  if (8 < dstSize) {
    uVar2 = (uint)*(byte *)((long)src + (srcSize - 1));
    local_98.ptr = (char *)dst;
    local_98.startPtr = (char *)dst;
    if ((srcSize & 1) == 0) {
      pbVar4 = (byte *)((long)src + (srcSize - 2));
      FSE_initCState2(&local_70,ct,uVar2);
      FSE_initCState2(&local_50,ct,(uint)*pbVar4);
    }
    else {
      FSE_initCState2(&local_50,ct,uVar2);
      FSE_initCState2(&local_70,ct,(uint)*(byte *)((long)src + (srcSize - 2)));
      pbVar4 = (byte *)((long)src + (srcSize - 3));
      FSE_encodeSymbol(&local_98,&local_50,(uint)*(byte *)((long)src + (srcSize - 3)));
      uVar2 = local_98.bitPos >> 3;
      puVar3 = (ulong *)((long)local_98.ptr + (ulong)uVar2);
      *(size_t *)local_98.ptr = local_98.bitContainer;
      local_98.ptr = (char *)puVar3;
      if ((fast == 0) && (local_98.endPtr < puVar3)) {
        local_98.ptr = local_98.endPtr;
      }
      local_98.bitPos = local_98.bitPos & 7;
      local_98.bitContainer = local_98.bitContainer >> ((byte)(uVar2 << 3) & 0x3f);
    }
    if ((srcSize & 2) == 0) {
      FSE_encodeSymbol(&local_98,&local_70,(uint)pbVar4[-1]);
      pbVar1 = pbVar4 + -2;
      pbVar4 = pbVar4 + -2;
      FSE_encodeSymbol(&local_98,&local_50,(uint)*pbVar1);
      uVar2 = local_98.bitPos >> 3;
      puVar3 = (ulong *)((long)local_98.ptr + (ulong)uVar2);
      *(size_t *)local_98.ptr = local_98.bitContainer;
      local_98.ptr = (char *)puVar3;
      if ((fast == 0) && (local_98.endPtr < puVar3)) {
        local_98.ptr = local_98.endPtr;
      }
      local_98.bitPos = local_98.bitPos & 7;
      local_98.bitContainer = local_98.bitContainer >> ((byte)(uVar2 << 3) & 0x3f);
    }
    while (src < pbVar4) {
      FSE_encodeSymbol(&local_98,&local_70,(uint)pbVar4[-1]);
      FSE_encodeSymbol(&local_98,&local_50,(uint)pbVar4[-2]);
      FSE_encodeSymbol(&local_98,&local_70,(uint)pbVar4[-3]);
      pbVar1 = pbVar4 + -4;
      pbVar4 = pbVar4 + -4;
      FSE_encodeSymbol(&local_98,&local_50,(uint)*pbVar1);
      *(size_t *)local_98.ptr = local_98.bitContainer;
      puVar3 = (ulong *)((ulong)(local_98.bitPos >> 3) + (long)local_98.ptr);
      local_98.ptr = local_98.endPtr;
      if (puVar3 <= local_98.endPtr) {
        local_98.ptr = (char *)puVar3;
      }
      if (fast != 0) {
        local_98.ptr = (char *)puVar3;
      }
      local_98.bitContainer = local_98.bitContainer >> ((byte)local_98.bitPos & 0x38);
      local_98.bitPos = local_98.bitPos & 7;
    }
    FSE_flushCState(&local_98,&local_70);
    FSE_flushCState(&local_98,&local_50);
    *(size_t *)local_98.ptr = local_98.bitContainer | 1L << ((ulong)local_98.bitPos & 0x3f);
    local_98.ptr = (char *)((ulong)(local_98.bitPos + 1 >> 3) + (long)local_98.ptr);
    if (local_98.endPtr < local_98.ptr) {
      local_98.ptr = local_98.endPtr;
    }
    if (local_98.ptr < local_98.endPtr) {
      return (long)local_98.ptr +
             ((ulong)((local_98.bitPos + 1 & 7) != 0) - (long)local_98.startPtr);
    }
  }
  return 0;
}

Assistant:

static size_t FSE_compress_usingCTable_generic (void* dst, size_t dstSize,
                           const void* src, size_t srcSize,
                           const FSE_CTable* ct, const unsigned fast)
{
    const BYTE* const istart = (const BYTE*) src;
    const BYTE* const iend = istart + srcSize;
    const BYTE* ip=iend;

    BIT_CStream_t bitC;
    FSE_CState_t CState1, CState2;

    /* init */
    if (srcSize <= 2) return 0;
    { size_t const initError = BIT_initCStream(&bitC, dst, dstSize);
      if (FSE_isError(initError)) return 0; /* not enough space available to write a bitstream */ }

#define FSE_FLUSHBITS(s)  (fast ? BIT_flushBitsFast(s) : BIT_flushBits(s))

    if (srcSize & 1) {
        FSE_initCState2(&CState1, ct, *--ip);
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    } else {
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_initCState2(&CState1, ct, *--ip);
    }

    /* join to mod 4 */
    srcSize -= 2;
    if ((sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) && (srcSize & 2)) {  /* test bit 2 */
        FSE_encodeSymbol(&bitC, &CState2, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    }

    /* 2 or 4 encoding per loop */
    while ( ip>istart ) {

        FSE_encodeSymbol(&bitC, &CState2, *--ip);

        if (sizeof(bitC.bitContainer)*8 < FSE_MAX_TABLELOG*2+7 )   /* this test must be static */
            FSE_FLUSHBITS(&bitC);

        FSE_encodeSymbol(&bitC, &CState1, *--ip);

        if (sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) {  /* this test must be static */
            FSE_encodeSymbol(&bitC, &CState2, *--ip);
            FSE_encodeSymbol(&bitC, &CState1, *--ip);
        }

        FSE_FLUSHBITS(&bitC);
    }

    FSE_flushCState(&bitC, &CState2);
    FSE_flushCState(&bitC, &CState1);
    return BIT_closeCStream(&bitC);
}